

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::JoinHashTable::ScanStructure::NextMarkJoin
          (ScanStructure *this,DataChunk *keys,DataChunk *left,DataChunk *result)

{
  DataChunk *pDVar1;
  ulong *puVar2;
  bool bVar3;
  JoinHashTable *pJVar4;
  data_ptr_t pdVar5;
  unsigned_long *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var8;
  data_ptr_t pdVar9;
  data_ptr_t pdVar10;
  _Head_base<0UL,_bool_*,_false> _Var11;
  byte bVar12;
  element_type *peVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  SelectionVector *pSVar15;
  data_ptr_t pdVar16;
  int iVar17;
  reference pvVar18;
  reference pvVar19;
  pointer this_00;
  TemplatedValidityData<unsigned_long> *pTVar20;
  unsigned_long uVar21;
  _Head_base<0UL,_unsigned_long_*,_false> _Var22;
  idx_t idx_in_entry;
  ulong uVar23;
  idx_t idx_in_entry_1;
  ulong uVar24;
  DataChunk *result_00;
  size_type sVar25;
  UnifiedVectorFormat kdata;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  pthread_mutex_t *local_a8;
  ScanStructure *local_a0;
  UnifiedVectorFormat local_98;
  DataChunk *local_48;
  DataChunk *local_40;
  idx_t local_38;
  
  ScanKeyMatches(this,keys);
  pJVar4 = this->ht;
  if ((pJVar4->correlated_mark_join_info).correlated_types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pJVar4->correlated_mark_join_info).correlated_types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ConstructMarkJoinResult(this,keys,left,result);
  }
  else {
    local_a8 = (pthread_mutex_t *)&pJVar4->correlated_mark_join_info;
    local_a0 = this;
    local_40 = result;
    iVar17 = pthread_mutex_lock(local_a8);
    if (iVar17 != 0) {
      ::std::__throw_system_error(iVar17);
    }
    pDVar1 = &(pJVar4->correlated_mark_join_info).group_chunk;
    (pJVar4->correlated_mark_join_info).group_chunk.count = keys->count;
    if (*(pointer *)
         ((long)&(pJVar4->correlated_mark_join_info).group_chunk.data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data + 8) !=
        (pJVar4->correlated_mark_join_info).group_chunk.data.
        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar25 = 0;
      do {
        pvVar18 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,sVar25);
        pvVar19 = vector<duckdb::Vector,_true>::operator[](&keys->data,sVar25);
        Vector::Reference(pvVar18,pvVar19);
        sVar25 = sVar25 + 1;
      } while (sVar25 < (ulong)(((long)*(pointer *)
                                        ((long)&(pJVar4->correlated_mark_join_info).group_chunk.data
                                                .
                                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                .
                                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                ._M_impl.super__Vector_impl_data + 8) -
                                 (long)(pJVar4->correlated_mark_join_info).group_chunk.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x4ec4ec4ec4ec4ec5));
    }
    this_00 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
              ::operator->(&(pJVar4->correlated_mark_join_info).correlated_counts);
    result_00 = &(pJVar4->correlated_mark_join_info).result_chunk;
    GroupedAggregateHashTable::FetchAggregates(this_00,pDVar1,result_00);
    pDVar1 = local_40;
    local_40->count = left->count;
    local_48 = result_00;
    if ((left->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (left->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar25 = 0;
      do {
        pvVar18 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,sVar25);
        pvVar19 = vector<duckdb::Vector,_true>::operator[](&left->data,sVar25);
        Vector::Reference(pvVar18,pvVar19);
        sVar25 = sVar25 + 1;
      } while (sVar25 < (ulong)(((long)(left->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(left->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x4ec4ec4ec4ec4ec5));
    }
    pvVar18 = vector<duckdb::Vector,_true>::back(&keys->data);
    pvVar19 = vector<duckdb::Vector,_true>::back(&pDVar1->data);
    Vector::SetVectorType(pvVar19,FLAT_VECTOR);
    pdVar5 = pvVar19->data;
    FlatVector::VerifyFlatVector(pvVar19);
    if (pvVar18->vector_type == FLAT_VECTOR) {
      FlatVector::VerifyFlatVector(pvVar18);
      local_b8 = (element_type *)left->count;
      (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)local_b8;
      if ((pvVar18->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        p_Var7 = (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        _Var22._M_head_impl = (unsigned_long *)0x0;
      }
      else {
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                  ((duckdb *)&local_98,(unsigned_long **)&pvVar18->validity,
                   (unsigned_long *)&local_b8);
        pdVar9 = local_98.data;
        pSVar15 = local_98.sel;
        local_98.sel = (SelectionVector *)0x0;
        local_98.data = (data_ptr_t)0x0;
        p_Var7 = (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)pSVar15;
        (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar9;
        if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data);
        }
        pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            (&(pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.
                              validity_data);
        _Var22._M_head_impl =
             (pTVar20->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      }
      (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           _Var22._M_head_impl;
    }
    else if (pvVar18->vector_type == CONSTANT_VECTOR) {
      puVar6 = (pvVar18->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) {
        uVar24 = left->count;
        _Var22._M_head_impl =
             (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var22._M_head_impl == (unsigned_long *)0x0) {
          local_b8 = (element_type *)
                     (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_98,(unsigned_long *)&local_b8);
          pdVar9 = local_98.data;
          pSVar15 = local_98.sel;
          local_98.sel = (SelectionVector *)0x0;
          local_98.data = (data_ptr_t)0x0;
          p_Var7 = (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar15;
          (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar9;
          if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data);
          }
          pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var22._M_head_impl =
               (pTVar20->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var22._M_head_impl;
        }
        if (uVar24 != 0) {
          uVar23 = uVar24 + 0x3f >> 6;
          if (uVar23 != 1) {
            switchD_01043a80::default(_Var22._M_head_impl,0,uVar23 * 8 - 8);
          }
          uVar21 = -1L << ((byte)uVar24 & 0x3f);
          if ((uVar24 & 0x3f) == 0) {
            uVar21 = 0;
          }
          (_Var22._M_head_impl + 0xffffffffffffffff)[uVar23] = uVar21;
        }
      }
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_98);
      Vector::ToUnifiedFormat(pvVar18,keys->count,&local_98);
      if (left->count != 0) {
        uVar24 = 0;
        do {
          _Var8._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (((unsafe_unique_array<unsigned_long> *)&(local_98.sel)->sel_vector)->
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
          uVar23 = uVar24;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var8._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            uVar23 = (ulong)*(uint *)((long)_Var8._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>.
                                            _M_head_impl + uVar24 * 4);
          }
          if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            _Var22._M_head_impl =
                 (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
LAB_00f4a5da:
            if (_Var22._M_head_impl != (unsigned_long *)0x0) {
              _Var22._M_head_impl[uVar24 >> 6] =
                   _Var22._M_head_impl[uVar24 >> 6] | 1L << ((byte)uVar24 & 0x3f);
            }
          }
          else {
            _Var22._M_head_impl =
                 (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) != 0) goto LAB_00f4a5da;
            if (_Var22._M_head_impl == (unsigned_long *)0x0) {
              local_38 = (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_b8,&local_38);
              p_Var14 = p_Stack_b0;
              peVar13 = local_b8;
              local_b8 = (element_type *)0x0;
              p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var7 = (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar13;
              (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var14;
              if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
                 p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
              }
              pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var22._M_head_impl =
                   (pTVar20->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var22._M_head_impl;
            }
            bVar12 = (byte)uVar24 & 0x3f;
            _Var22._M_head_impl[uVar24 >> 6] =
                 _Var22._M_head_impl[uVar24 >> 6] &
                 (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 < left->count);
      }
      if (local_98.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    pDVar1 = local_48;
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&local_48->data,0);
    pdVar9 = pvVar18->data;
    pvVar18 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,1);
    this = local_a0;
    if (left->count != 0) {
      pdVar10 = pvVar18->data;
      uVar24 = 0;
      do {
        _Var11._M_head_impl =
             (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
             super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
             super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
             super__Head_base<0UL,_bool_*,_false>._M_head_impl;
        if (_Var11._M_head_impl == (bool *)0x0) {
          pdVar5[uVar24] = '\0';
LAB_00f4a6a5:
          if (*(long *)(pdVar10 + uVar24 * 8) < *(long *)(pdVar9 + uVar24 * 8)) {
            _Var22._M_head_impl =
                 (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var22._M_head_impl == (unsigned_long *)0x0) {
              local_b8 = (element_type *)
                         (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_98,(unsigned_long *)&local_b8);
              pdVar16 = local_98.data;
              pSVar15 = local_98.sel;
              local_98.sel = (SelectionVector *)0x0;
              local_98.data = (data_ptr_t)0x0;
              p_Var7 = (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pSVar15;
              (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar16;
              if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.data);
              }
              pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var22._M_head_impl =
                   (pTVar20->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var22._M_head_impl;
              this = local_a0;
            }
            bVar12 = (byte)uVar24 & 0x3f;
            _Var22._M_head_impl[uVar24 >> 6] =
                 _Var22._M_head_impl[uVar24 >> 6] &
                 (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
          }
        }
        else {
          bVar3 = _Var11._M_head_impl[uVar24];
          pdVar5[uVar24] = bVar3;
          if (bVar3 == false) goto LAB_00f4a6a5;
        }
        if ((*(long *)(pdVar9 + uVar24 * 8) == 0) &&
           (puVar6 = (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
           puVar6 != (unsigned_long *)0x0)) {
          puVar2 = puVar6 + (uVar24 >> 6);
          *puVar2 = *puVar2 | 1L << ((byte)uVar24 & 0x3f);
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 < left->count);
    }
    pthread_mutex_unlock(local_a8);
  }
  this->finished = true;
  return;
}

Assistant:

void ScanStructure::NextMarkJoin(DataChunk &keys, DataChunk &left, DataChunk &result) {
	D_ASSERT(result.ColumnCount() == left.ColumnCount() + 1);
	D_ASSERT(result.data.back().GetType() == LogicalType::BOOLEAN);
	// this method should only be called for a non-empty HT
	D_ASSERT(ht.Count() > 0);

	ScanKeyMatches(keys);
	if (ht.correlated_mark_join_info.correlated_types.empty()) {
		ConstructMarkJoinResult(keys, left, result);
	} else {
		auto &info = ht.correlated_mark_join_info;
		lock_guard<mutex> mj_lock(info.mj_lock);

		// there are correlated columns
		// first we fetch the counts from the aggregate hashtable corresponding to these entries
		D_ASSERT(keys.ColumnCount() == info.group_chunk.ColumnCount() + 1);
		info.group_chunk.SetCardinality(keys);
		for (idx_t i = 0; i < info.group_chunk.ColumnCount(); i++) {
			info.group_chunk.data[i].Reference(keys.data[i]);
		}
		info.correlated_counts->FetchAggregates(info.group_chunk, info.result_chunk);

		// for the initial set of columns we just reference the left side
		result.SetCardinality(left);
		for (idx_t i = 0; i < left.ColumnCount(); i++) {
			result.data[i].Reference(left.data[i]);
		}
		// create the result matching vector
		auto &last_key = keys.data.back();
		auto &result_vector = result.data.back();
		// first set the nullmask based on whether or not there were NULL values in the join key
		result_vector.SetVectorType(VectorType::FLAT_VECTOR);
		auto bool_result = FlatVector::GetData<bool>(result_vector);
		auto &mask = FlatVector::Validity(result_vector);
		switch (last_key.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR:
			if (ConstantVector::IsNull(last_key)) {
				mask.SetAllInvalid(left.size());
			}
			break;
		case VectorType::FLAT_VECTOR:
			mask.Copy(FlatVector::Validity(last_key), left.size());
			break;
		default: {
			UnifiedVectorFormat kdata;
			last_key.ToUnifiedFormat(keys.size(), kdata);
			for (idx_t i = 0; i < left.size(); i++) {
				auto kidx = kdata.sel->get_index(i);
				mask.Set(i, kdata.validity.RowIsValid(kidx));
			}
			break;
		}
		}

		auto count_star = FlatVector::GetData<int64_t>(info.result_chunk.data[0]);
		auto count = FlatVector::GetData<int64_t>(info.result_chunk.data[1]);
		// set the entries to either true or false based on whether a match was found
		for (idx_t i = 0; i < left.size(); i++) {
			D_ASSERT(count_star[i] >= count[i]);
			bool_result[i] = found_match ? found_match[i] : false;
			if (!bool_result[i] && count_star[i] > count[i]) {
				// RHS has NULL value and result is false: set to null
				mask.SetInvalid(i);
			}
			if (count_star[i] == 0) {
				// count == 0, set nullmask to false (we know the result is false now)
				mask.SetValid(i);
			}
		}
	}
	finished = true;
}